

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.h
# Opt level: O2

void __thiscall
ExtDataBlockInfo::ExtDataBlockInfo
          (ExtDataBlockInfo *this,uint8_t *a_data,int a_dataLen,int a_id1,int a_id2)

{
  pointer __dest;
  pointer puVar1;
  
  (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->id1 = a_id1;
  this->id2 = a_id2;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->data,(long)a_dataLen);
  __dest = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__dest != puVar1) {
    memcpy(__dest,a_data,(long)puVar1 - (long)__dest);
    return;
  }
  return;
}

Assistant:

ExtDataBlockInfo(const uint8_t* a_data, const int a_dataLen, const int a_id1, const int a_id2)
        : id1(a_id1), id2(a_id2)
    {
        data.resize(a_dataLen);
        if (!data.empty())
            memcpy(data.data(), a_data, data.size());
    }